

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

xml_node<char> * __thiscall
rapidxml::xml_node<char>::next_sibling
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  xml_node<char> *pxVar5;
  byte *pbVar6;
  char *end;
  byte *pbVar7;
  bool bVar8;
  
  if ((this->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
    __assert_fail("this->m_parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/rapidxml/rapidxml.hpp"
                  ,0x3ee,
                  "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                 );
  }
  if (name == (char *)0x0) {
    pxVar5 = this->m_next_sibling;
  }
  else {
    if (name_size == 0) {
      sVar4 = 0xffffffffffffffff;
      do {
        name_size = sVar4 + 1;
        lVar3 = sVar4 + 1;
        sVar4 = name_size;
      } while (name[lVar3] != '\0');
    }
    pxVar5 = this->m_next_sibling;
    if (pxVar5 != (xml_node<char> *)0x0) {
      do {
        pbVar6 = (byte *)(pxVar5->super_xml_base<char>).m_name;
        if (pbVar6 == (byte *)0x0) {
          pbVar6 = &xml_base<char>::nullstr()::zero;
          sVar4 = 0;
        }
        else {
          sVar4 = (pxVar5->super_xml_base<char>).m_name_size;
        }
        if (sVar4 == name_size) {
          pbVar1 = pbVar6 + sVar4;
          bVar8 = 0 < (long)sVar4;
          if (case_sensitive) {
            if ((long)sVar4 < 1) {
              return pxVar5;
            }
            pbVar7 = (byte *)(name + 1);
            if (*pbVar6 == *name) {
              do {
                pbVar6 = pbVar6 + 1;
                bVar8 = pbVar6 < pbVar1;
                if (!bVar8) {
                  return pxVar5;
                }
                bVar2 = *pbVar7;
                pbVar7 = pbVar7 + 1;
              } while (*pbVar6 == bVar2);
            }
          }
          else {
            if ((long)sVar4 < 1) {
              return pxVar5;
            }
            pbVar7 = (byte *)(name + 1);
            if (internal::lookup_tables<0>::lookup_upcase[*pbVar6] ==
                internal::lookup_tables<0>::lookup_upcase[(byte)*name]) {
              do {
                pbVar6 = pbVar6 + 1;
                bVar8 = pbVar6 < pbVar1;
                if (!bVar8) {
                  return pxVar5;
                }
                bVar2 = *pbVar7;
                pbVar7 = pbVar7 + 1;
              } while (internal::lookup_tables<0>::lookup_upcase[*pbVar6] ==
                       internal::lookup_tables<0>::lookup_upcase[bVar2]);
            }
          }
          if (!bVar8) {
            return pxVar5;
          }
        }
        pxVar5 = pxVar5->m_next_sibling;
      } while (pxVar5 != (xml_node<char> *)0x0);
    }
  }
  return pxVar5;
}

Assistant:

xml_node<Ch> *next_sibling(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            assert(this->m_parent);     // Cannot query for siblings if node has no parent
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_node<Ch> *sibling = m_next_sibling; sibling; sibling = sibling->m_next_sibling)
                    if (internal::compare(sibling->name(), sibling->name_size(), name, name_size, case_sensitive))
                        return sibling;
                return 0;
            }
            else
                return m_next_sibling;
        }